

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume.hpp
# Opt level: O0

string * __thiscall VolumeFile::normalizeFilePath(VolumeFile *this,string *path)

{
  string *in_RDX;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,in_RDX);
  return in_RDI;
}

Assistant:

virtual std::string normalizeFilePath(const std::string& path) const
	{
		return path;
	}